

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O0

void __thiscall czh::token::Token::Token<double>(Token *this,TokenType type_,double what_,Pos *pos_)

{
  Pos *pos__local;
  double what__local;
  Token *pTStack_10;
  TokenType type__local;
  Token *this_local;
  
  this->type = type_;
  pos__local = (Pos *)what_;
  what__local._4_4_ = type_;
  pTStack_10 = this;
  czh::value::Value::Value<double>(&this->what,(double *)&pos__local);
  Pos::Pos(&this->pos,pos_);
  return;
}

Assistant:

Token(TokenType type_, T what_, Pos pos_)
        :type(type_), what(std::move(what_)), pos(std::move(pos_)) {}